

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
DynamicHistogram<double>::DynamicHistogram
          (DynamicHistogram<double> *this,DynamicHistogramOptions *options)

{
  double dVar1;
  value_type_conflict3 local_38;
  value_type_conflict3 local_30 [3];
  DynamicHistogramOptions *local_18;
  DynamicHistogramOptions *options_local;
  DynamicHistogram<double> *this_local;
  
  this->_vptr_DynamicHistogram = (_func_int **)&PTR__DynamicHistogram_002c2828;
  this->_binCount = options->binCount;
  local_18 = options;
  options_local = (DynamicHistogramOptions *)this;
  dVar1 = std::numeric_limits<double>::max();
  this->_binMax = -dVar1;
  dVar1 = std::numeric_limits<double>::max();
  this->_binMin = dVar1;
  this->_binWidth = 0.0;
  FixedSizeCache<double>::FixedSizeCache(&this->_cache,1000);
  this->_enabled = (bool)(local_18->enabled & 1);
  std::vector<double,_std::allocator<double>_>::vector(&this->_frequencies);
  this->_initialized = false;
  this->_numMerges = 0;
  std::vector<double,_std::allocator<double>_>::vector(&this->_temp);
  FixedSizeCache<double>::initialize(&this->_cache,local_18->cacheSize);
  local_30[0] = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->_frequencies,(long)local_18->binCount,local_30);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->_temp,(long)local_18->binCount,&local_38);
  return;
}

Assistant:

DynamicHistogram(DynamicHistogramOptions const & options = DynamicHistogramOptions()) :
        _binCount(options.binCount),
        _binMax(-std::numeric_limits<double>::max()),
        _binMin(std::numeric_limits<double>::max()),
        _binWidth(0),
        _enabled(options.enabled),
        _initialized(false),
        _numMerges(0)
    {
        this->_cache.initialize(options.cacheSize);
        this->_frequencies.resize(options.binCount, 0);
        this->_temp.resize(options.binCount, 0);
    }